

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool execCommand(QString *program,QStringList *args,QByteArray *output,bool verbose)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QLatin1String QVar5;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QByteArray local_88;
  QString *local_68;
  undefined1 *puStack_60;
  char *local_58;
  QArrayData *pQStack_50;
  char *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x20);
  QtPrivate::QStringList_join((QList *)&local_88,(QChar *)args,(longlong)&local_98);
  __stream = _stdout;
  puStack_60 = (undefined1 *)0x1;
  local_58 = " ";
  pQStack_50 = &(local_88.d.d)->super_QArrayData;
  local_48 = local_88.d.ptr;
  puStack_40 = (undefined1 *)local_88.d.size;
  local_68 = program;
  if (((int)CONCAT71(in_register_00000009,verbose) != 0) && (g_options.verbose == true)) {
    QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
    ::toUtf8(&local_88,
             (QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
              *)&local_68);
    pcVar3 = local_88.d.ptr;
    if (local_88.d.ptr == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    fprintf(__stream,"Execute %s.\n",pcVar3);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_98,(QObject *)0x0);
  QProcess::start(&local_98,program,args,3);
  cVar1 = QProcess::waitForStarted((int)&local_98);
  if (cVar1 == '\0') {
    execCommand();
  }
  else {
    QVar5.m_data = (char *)0x3;
    QVar5.m_size = (qsizetype)program;
    QString::endsWith(QVar5,0x1117d4);
    cVar1 = QProcess::waitForFinished((int)&local_98);
    if (cVar1 != '\0') {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QProcess::readAllStandardOutput();
      if (output != (QByteArray *)0x0) {
        QByteArray::append(output);
      }
      if ((verbose) && (g_options.verbose == true)) {
        pcVar3 = local_88.d.ptr;
        if (local_88.d.ptr == (char *)0x0) {
          pcVar3 = (char *)&QByteArray::_empty;
        }
        fprintf(_stdout,"%s\n",pcVar3);
      }
      iVar2 = QProcess::exitCode();
      bVar4 = iVar2 == 0;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0010cb88;
    }
    execCommand();
  }
  bVar4 = false;
LAB_0010cb88:
  QProcess::~QProcess((QProcess *)&local_98);
  if (pQStack_50 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool execCommand(const QString &program, const QStringList &args,
                        QByteArray *output = nullptr, bool verbose = false)
{
    const auto command = program + " "_L1 + args.join(u' ');

    if (verbose && g_options.verbose)
        fprintf(stdout,"Execute %s.\n", command.toUtf8().constData());

    QProcess process;
    process.start(program, args);
    if (!process.waitForStarted()) {
        qCritical("Cannot execute command %s.", qPrintable(command));
        return false;
    }

    // If the command is not adb, for example, make or ninja, it can take more that
    // QProcess::waitForFinished() 30 secs, so for that use a higher timeout.
    const int FinishTimeout = program.endsWith("adb"_L1) ? 30000 : g_options.timeoutSecs * 1000;
    if (!process.waitForFinished(FinishTimeout)) {
        qCritical("Execution of command %s timed out.", qPrintable(command));
        return false;
    }

    const auto stdOut = process.readAllStandardOutput();
    if (output)
        output->append(stdOut);

    if (verbose && g_options.verbose)
        fprintf(stdout, "%s\n", stdOut.constData());

    return process.exitCode() == 0;
}